

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O3

container_t *
container_ixor(container_t *c1,uint8_t type1,container_t *c2,uint8_t type2,uint8_t *result_type)

{
  _Bool _Var1;
  int iVar2;
  uint8_t uVar3;
  undefined7 in_register_00000031;
  container_t *result;
  byte local_29;
  container_t *local_28;
  
  local_29 = type1;
  if ((int)CONCAT71(in_register_00000031,type1) == 4) {
    c1 = shared_container_extract_copy((shared_container_t *)c1,&local_29);
  }
  if (type2 == '\x04') {
    type2 = *(byte *)((long)c2 + 8);
    if (type2 == 4) {
      __assert_fail("*type != SHARED_CONTAINER_TYPE",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/RoaringBitmap[P]croaring_cmake_demo_from_single_header/dependencies/croaring/roaring.c"
                    ,0x1062,
                    "const container_t *container_unwrap_shared(const container_t *, uint8_t *)");
    }
    c2 = *c2;
  }
  local_28 = (container_t *)0x0;
  switch((uint)type2 + (uint)local_29 * 4) {
  case 5:
    _Var1 = bitset_bitset_container_xor((bitset_container_t *)c1,(bitset_container_t *)c2,&local_28)
    ;
    break;
  case 6:
    _Var1 = bitset_array_container_ixor((bitset_container_t *)c1,(array_container_t *)c2,&local_28);
    uVar3 = '\x02' - _Var1;
    goto LAB_0010a52e;
  case 7:
    _Var1 = run_bitset_container_xor((run_container_t *)c2,(bitset_container_t *)c1,&local_28);
    break;
  default:
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/RoaringBitmap[P]croaring_cmake_demo_from_single_header/dependencies/croaring/roaring.c"
                  ,0x16e4,
                  "container_t *container_ixor(container_t *, uint8_t, const container_t *, uint8_t, uint8_t *)"
                 );
  case 9:
    _Var1 = array_bitset_container_xor((array_container_t *)c1,(bitset_container_t *)c2,&local_28);
    goto LAB_0010a4e8;
  case 10:
    _Var1 = array_array_container_xor((array_container_t *)c1,(array_container_t *)c2,&local_28);
LAB_0010a4e8:
    array_container_free((array_container_t *)c1);
    goto LAB_0010a528;
  case 0xb:
    iVar2 = array_run_container_xor((array_container_t *)c1,(run_container_t *)c2,&local_28);
    uVar3 = (uint8_t)iVar2;
    array_container_free((array_container_t *)c1);
    goto LAB_0010a52e;
  case 0xd:
    _Var1 = run_bitset_container_xor((run_container_t *)c1,(bitset_container_t *)c2,&local_28);
    run_container_free((run_container_t *)c1);
    goto LAB_0010a528;
  case 0xe:
    iVar2 = array_run_container_xor((array_container_t *)c2,(run_container_t *)c1,&local_28);
    uVar3 = (uint8_t)iVar2;
    goto LAB_0010a4cc;
  case 0xf:
    iVar2 = run_run_container_xor((run_container_t *)c1,(run_container_t *)c2,&local_28);
    uVar3 = (uint8_t)iVar2;
LAB_0010a4cc:
    run_container_free((run_container_t *)c1);
    goto LAB_0010a52e;
  }
  bitset_container_free((bitset_container_t *)c1);
LAB_0010a528:
  uVar3 = '\x02' - _Var1;
LAB_0010a52e:
  *result_type = uVar3;
  return local_28;
}

Assistant:

static inline container_t *container_ixor(
    container_t *c1, uint8_t type1,
    const container_t *c2, uint8_t type2,
    uint8_t *result_type
){
    c1 = get_writable_copy_if_shared(c1, &type1);
    c2 = container_unwrap_shared(c2, &type2);
    container_t *result = NULL;
    switch (PAIR_CONTAINER_TYPES(type1, type2)) {
        case CONTAINER_PAIR(BITSET,BITSET):
            *result_type = bitset_bitset_container_ixor(
                                CAST_bitset(c1), const_CAST_bitset(c2), &result)
                                    ? BITSET_CONTAINER_TYPE
                                    : ARRAY_CONTAINER_TYPE;
            return result;

        case CONTAINER_PAIR(ARRAY,ARRAY):
            *result_type = array_array_container_ixor(
                                CAST_array(c1), const_CAST_array(c2), &result)
                                    ? BITSET_CONTAINER_TYPE
                                    : ARRAY_CONTAINER_TYPE;
            return result;

        case CONTAINER_PAIR(RUN,RUN):
            *result_type = run_run_container_ixor(
                CAST_run(c1), const_CAST_run(c2), &result);
            return result;

        case CONTAINER_PAIR(BITSET,ARRAY):
            *result_type = bitset_array_container_ixor(
                                CAST_bitset(c1), const_CAST_array(c2), &result)
                                    ? BITSET_CONTAINER_TYPE
                                    : ARRAY_CONTAINER_TYPE;
            return result;

        case CONTAINER_PAIR(ARRAY,BITSET):
            *result_type = array_bitset_container_ixor(
                                CAST_array(c1), const_CAST_bitset(c2), &result)
                                    ? BITSET_CONTAINER_TYPE
                                    : ARRAY_CONTAINER_TYPE;
            return result;

        case CONTAINER_PAIR(BITSET,RUN):
            *result_type =
                bitset_run_container_ixor(
                    CAST_bitset(c1), const_CAST_run(c2), &result)
                        ? BITSET_CONTAINER_TYPE
                        : ARRAY_CONTAINER_TYPE;

            return result;

        case CONTAINER_PAIR(RUN,BITSET):
            *result_type = run_bitset_container_ixor(
                                CAST_run(c1), const_CAST_bitset(c2), &result)
                                    ? BITSET_CONTAINER_TYPE
                                    : ARRAY_CONTAINER_TYPE;
            return result;

        case CONTAINER_PAIR(ARRAY,RUN):
            *result_type = array_run_container_ixor(
                                CAST_array(c1), const_CAST_run(c2), &result);
            return result;

        case CONTAINER_PAIR(RUN,ARRAY):
            *result_type = run_array_container_ixor(
                                CAST_run(c1), const_CAST_array(c2), &result);
            return result;

        default:
            assert(false);
            __builtin_unreachable();
            return NULL;
    }
}